

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O0

void __thiscall commodities_custom_Test::~commodities_custom_Test(commodities_custom_Test *this)

{
  commodities_custom_Test *this_local;
  
  ~commodities_custom_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, custom)
{
    addCustomCommodity("unit_tests", 26262352U);
    auto c = getCommodity("unit_tests");
    EXPECT_EQ(c, 26262352U);
    clearCustomCommodities();

    c = getCommodity("unit_tests");
    EXPECT_NE(c, 26262352U);
    clearCustomCommodities();
}